

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_scaling_square.c
# Opt level: O3

int16_t WebRtcSpl_GetScalingSquare(int16_t *in_vector,size_t in_vector_length,size_t times)

{
  short sVar1;
  int iVar2;
  short sVar3;
  size_t sVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  size_t looptimes;
  int16_t *sptr;
  ushort uVar8;
  short sVar9;
  
  uVar6 = (uint)times;
  sVar5 = -1;
  if (in_vector_length != 0) {
    sVar4 = 0;
    do {
      sVar1 = in_vector[sVar4];
      sVar9 = -sVar1;
      if (0 < sVar1) {
        sVar9 = sVar1;
      }
      if (sVar5 < sVar9) {
        sVar5 = sVar9;
      }
      sVar4 = sVar4 + 1;
    } while (in_vector_length != sVar4);
  }
  uVar7 = (int)sVar5 * (int)sVar5;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar9 = 0;
  sVar1 = ((ushort)iVar2 ^ 0x1f) - 1;
  if (sVar5 == 0) {
    sVar1 = sVar9;
  }
  uVar8 = 0x20;
  if (uVar6 != 0) {
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar8 = (ushort)iVar2 ^ 0x1f;
  }
  sVar3 = (0x20 - uVar8) - sVar1;
  if ((short)(0x20 - uVar8) < sVar1) {
    sVar3 = sVar9;
  }
  if (sVar5 == 0) {
    sVar3 = sVar9;
  }
  return sVar3;
}

Assistant:

int16_t WebRtcSpl_GetScalingSquare(int16_t* in_vector,
                                   size_t in_vector_length,
                                   size_t times)
{
    int16_t nbits = WebRtcSpl_GetSizeInBits((uint32_t)times);
    size_t i;
    int16_t smax = -1;
    int16_t sabs;
    int16_t *sptr = in_vector;
    int16_t t;
    size_t looptimes = in_vector_length;

    for (i = looptimes; i > 0; i--)
    {
        sabs = (*sptr > 0 ? *sptr++ : -*sptr++);
        smax = (sabs > smax ? sabs : smax);
    }
    t = WebRtcSpl_NormW32(WEBRTC_SPL_MUL(smax, smax));

    if (smax == 0)
    {
        return 0; // Since norm(0) returns 0
    } else
    {
        return (t > nbits) ? 0 : nbits - t;
    }
}